

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::
     ReadPackedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
               (CodedInputStream *input,RepeatedField<int> *values)

{
  bool bVar1;
  int iVar2;
  RepeatedField<int> *values_local;
  CodedInputStream *input_local;
  Limit local_40;
  int value;
  Limit limit;
  uint32 length;
  CodedInputStream *local_30;
  bool local_25;
  uint32 local_24;
  uint32 *puStack_20;
  uint32 temp;
  CodedInputStream *local_18;
  undefined1 local_9;
  
  _limit = values;
  local_30 = input;
  bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&value);
  if (bVar1) {
    local_40 = io::CodedInputStream::PushLimit(local_30,value);
    while (iVar2 = io::CodedInputStream::BytesUntilLimit(local_30), 0 < iVar2) {
      local_18 = local_30;
      puStack_20 = (uint32 *)((long)&input_local + 4);
      local_9 = io::CodedInputStream::ReadVarint32(local_30,&local_24);
      if (!(bool)local_9) {
        return false;
      }
      *puStack_20 = local_24;
      RepeatedField<int>::Add(_limit,(int *)((long)&input_local + 4));
    }
    io::CodedInputStream::PopLimit(local_30,local_40);
    local_25 = true;
  }
  else {
    local_25 = false;
  }
  return local_25;
}

Assistant:

bool WireFormatLite::ReadPackedPrimitiveNoInline(io::CodedInputStream* input,
                                                 RepeatedField<CType>* values) {
  return ReadPackedPrimitive<CType, DeclaredType>(input, values);
}